

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

void jsgf_rhs_free(jsgf_rhs_t *rhs)

{
  glist_t local_18;
  gnode_t *gn;
  jsgf_rhs_t *rhs_local;
  
  if (rhs != (jsgf_rhs_t *)0x0) {
    jsgf_rhs_free(rhs->alt);
    for (local_18 = rhs->atoms; local_18 != (glist_t)0x0; local_18 = local_18->next) {
      jsgf_atom_free((jsgf_atom_t *)(local_18->data).ptr);
    }
    glist_free(rhs->atoms);
    ckd_free(rhs);
  }
  return;
}

Assistant:

static void
jsgf_rhs_free(jsgf_rhs_t * rhs)
{
    gnode_t *gn;

    if (rhs == NULL)
        return;

    jsgf_rhs_free(rhs->alt);
    for (gn = rhs->atoms; gn; gn = gnode_next(gn))
        jsgf_atom_free(gnode_ptr(gn));
    glist_free(rhs->atoms);
    ckd_free(rhs);
}